

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::JapaneseCalendar::getActualMaximum
          (JapaneseCalendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  int32_t nextEraStart [3];
  int local_40 [4];
  
  if (field != UCAL_YEAR) {
    iVar3 = GregorianCalendar::getActualMaximum(&this->super_GregorianCalendar,field,status);
    return iVar3;
  }
  iVar5 = 0;
  iVar3 = Calendar::get((Calendar *)this,UCAL_ERA,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar3 == gCurrentEra) {
      iVar4 = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x1f])
                        (this,1,3);
      return iVar4;
    }
    local_40[2] = 0;
    local_40[0] = 0;
    local_40[1] = 0;
    EraRules::getStartDate(gJapaneseEraRules,iVar3 + 1,(int32_t (*) [3])local_40,status);
    iVar2 = local_40[2];
    iVar4 = local_40[0];
    iVar1 = local_40[1];
    iVar3 = EraRules::getStartYear(gJapaneseEraRules,iVar3,status);
    iVar5 = (uint)(iVar2 != 1 || iVar1 != 1) + (iVar4 - iVar3);
  }
  return iVar5;
}

Assistant:

int32_t JapaneseCalendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const {
    if (field == UCAL_YEAR) {
        int32_t era = get(UCAL_ERA, status);
        if (U_FAILURE(status)) {
            return 0; // error case... any value
        }
        if (era == gCurrentEra) {
            // TODO: Investigate what value should be used here - revisit after 4.0.
            return handleGetLimit(UCAL_YEAR, UCAL_LIMIT_MAXIMUM);
        } else {
            int32_t nextEraStart[3] = { 0,0,0 };
            gJapaneseEraRules->getStartDate(era + 1, nextEraStart, status);
            int32_t nextEraYear = nextEraStart[0];
            int32_t nextEraMonth = nextEraStart[1]; // 1-base
            int32_t nextEraDate = nextEraStart[2];

            int32_t eraStartYear = gJapaneseEraRules->getStartYear(era, status);
            int32_t maxYear = nextEraYear - eraStartYear + 1;   // 1-base
            if (nextEraMonth == 1 && nextEraDate == 1) {
                // Subtract 1, because the next era starts at Jan 1
                maxYear--;
            }
            return maxYear;
        }
    }
    return GregorianCalendar::getActualMaximum(field, status);
}